

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::deleteTextures(ReferenceContext *this,int numTextures,deUint32 *textures)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  ulong uVar5;
  bool bVar6;
  
  if (0 < numTextures) {
    p_Var1 = &(this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header;
    uVar5 = 0;
    do {
      uVar2 = textures[uVar5];
      p_Var3 = (this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var4 = &p_Var1->_M_header;
      if (p_Var3 != (_Base_ptr)0x0 && uVar2 != 0) {
        do {
          bVar6 = (uint)*(size_t *)(p_Var3 + 1) < uVar2;
          if (!bVar6) {
            p_Var4 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[bVar6];
        } while (p_Var3 != (_Base_ptr)0x0);
        if ((((_Rb_tree_header *)p_Var4 != p_Var1) &&
            ((uint)((_Rb_tree_header *)p_Var4)->_M_node_count <= uVar2)) &&
           (*(Texture **)((long)p_Var4 + 0x28) != (Texture *)0x0)) {
          deleteTexture(this,*(Texture **)((long)p_Var4 + 0x28));
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)numTextures);
  }
  return;
}

Assistant:

void ReferenceContext::deleteTextures (int numTextures, const deUint32* textures)
{
	for (int i = 0; i < numTextures; i++)
	{
		deUint32	name		= textures[i];
		Texture*	texture		= name ? m_textures.find(name) : DE_NULL;

		if (texture)
			deleteTexture(texture);
	}
}